

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O2

double __thiscall
double_conversion::StringToDoubleConverter::StringToIeee<char_const*>
          (StringToDoubleConverter *this,char *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  char **end_00;
  byte bVar1;
  uc16 separator;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [12];
  char **ppcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  long lVar10;
  undefined8 uVar11;
  ulong uVar12;
  byte bVar13;
  char cVar14;
  uint uVar15;
  undefined7 in_register_00000009;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  ulong extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  char **ppcVar16;
  char **ppcVar17;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  int iVar18;
  byte bVar19;
  Double *this_00;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  char *pcVar24;
  int iVar25;
  long in_FS_OFFSET;
  float fVar26;
  double dVar27;
  DiyFp diy_fp;
  Vector<const_char> VVar28;
  Vector<const_char> trimmed;
  Vector<const_char> trimmed_00;
  undefined4 in_stack_fffffffffffffc40;
  uint uVar29;
  undefined4 uVar30;
  int local_3b0;
  undefined1 local_361;
  char *end;
  char **local_358;
  char *start;
  char buffer [782];
  
  ppcVar17 = (char **)CONCAT71(in_register_00000009,read_as_double);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  end_00 = (char **)(input + length);
  *processed_characters_count = 0;
  end = (char *)end_00;
  local_358 = (char **)input;
  if (length == 0) {
    dVar27 = this->empty_string_value_;
    goto LAB_0039834e;
  }
  uVar2 = this->flags_;
  iVar21 = (int)input;
  if ((uVar2 & 0x18) != 0) {
    bVar6 = AdvanceToNonspace<char_const*>((char **)&local_358,(char *)end_00);
    if (!bVar6) {
      *processed_characters_count = (int)local_358 - iVar21;
      dVar27 = this->empty_string_value_;
      goto LAB_0039834e;
    }
    bVar13 = local_358 == (char **)input | (byte)((uVar2 & 8) >> 3);
    ppcVar17 = (char **)CONCAT71((int7)((ulong)ppcVar17 >> 8),bVar13);
    if (bVar13 != 0) goto LAB_003979b0;
LAB_00397a1f:
    dVar27 = this->junk_string_value_;
    goto LAB_0039834e;
  }
LAB_003979b0:
  cVar9 = *(char *)local_358;
  if ((cVar9 == '-') || (cVar9 == '+')) {
    bVar6 = cVar9 == '-';
    pcVar24 = (char *)((long)local_358 + 1);
    buffer._0_8_ = pcVar24;
    bVar7 = AdvanceToNonspace<char_const*>((char **)buffer,(char *)end_00);
    if ((!bVar7) ||
       (ppcVar17 = (char **)0x0,
       pcVar24 != (char *)buffer._0_8_ && (char)((uVar2 & 0x20) >> 5) == '\0')) goto LAB_00397a1f;
    local_358 = (char **)buffer._0_8_;
    cVar9 = *(char *)buffer._0_8_;
  }
  else {
    bVar6 = false;
  }
  ppcVar5 = local_358;
  if (this->infinity_symbol_ == (char *)0x0) {
LAB_00397ab8:
    if (this->nan_symbol_ != (char *)0x0) {
      bVar8 = SUB41((uVar2 & 0x40) >> 6,0);
      bVar7 = anon_unknown_0::ConsumeFirstCharacter(cVar9,this->nan_symbol_,bVar8);
      if (bVar7) {
        bVar7 = (anonymous_namespace)::ConsumeSubString<char_const*>
                          ((char **)&local_358,(char *)end_00,this->nan_symbol_,bVar8);
        if (!bVar7) goto LAB_00398348;
        if ((uVar2 & 0x14) == 0) {
          if (local_358 != end_00) goto LAB_00397eee;
LAB_00397ed8:
          bVar7 = AdvanceToNonspace<char_const*>((char **)&local_358,(char *)end_00);
          if (bVar7) goto LAB_00397eee;
        }
        else if ((uVar2 & 4) == 0) goto LAB_00397ed8;
        *processed_characters_count = (int)local_358 - iVar21;
        if (bVar6 == false) {
          dVar27 = NAN;
        }
        else {
          dVar27 = -NAN;
        }
        goto LAB_0039834e;
      }
      cVar9 = *(char *)ppcVar5;
    }
    separator = this->separator_;
    bVar13 = 0;
    if (cVar9 != '0') {
LAB_00397b38:
      uVar29 = 0;
      bVar7 = false;
      local_3b0 = 0;
      iVar23 = 0;
      do {
        bVar1 = *(byte *)local_358;
        uVar15 = (uint)CONCAT71((int7)((ulong)ppcVar17 >> 8),bVar1);
        ppcVar17 = (char **)(ulong)(uVar15 - 0x30);
        if (9 < (byte)(uVar15 - 0x30)) {
          bVar19 = bVar13;
          if (iVar23 == 0) {
            bVar19 = 0;
          }
          iVar18 = 0;
          if (bVar1 != 0x2e) goto LAB_00397f8e;
          if ((((byte)uVar2 >> 2 | ~bVar19) & 1) == 0) goto LAB_00397eee;
          iVar18 = 0;
          ppcVar5 = local_358;
          if ((bVar19 & 1) != 0) goto LAB_00397be8;
          ppcVar16 = &end;
          bVar8 = Advance<char_const*>((char **)&local_358,separator,10,ppcVar16);
          if (bVar8) {
            ppcVar17 = extraout_RDX_00;
            ppcVar5 = local_358;
            bVar19 = bVar13;
            if (iVar23 != 0) goto LAB_00397be8;
            ppcVar17 = extraout_RDX_00;
            if (cVar9 != '0') goto LAB_00397eee;
            goto LAB_00397dfd;
          }
          iVar18 = 0;
          if (iVar23 != 0) goto LAB_00397f2c;
          iVar18 = 0;
          goto LAB_0039839f;
        }
        if (iVar23 < 0x304) {
          lVar10 = (long)(int)uVar29;
          uVar29 = uVar29 + 1;
          buffer[lVar10] = bVar1;
          iVar23 = iVar23 + 1;
        }
        else {
          local_3b0 = local_3b0 + 1;
          bVar7 = (bool)(bVar1 != 0x30 | bVar7);
        }
        bVar13 = bVar13 & bVar1 < 0x38;
        ppcVar17 = &end;
        bVar8 = Advance<char_const*>((char **)&local_358,separator,10,&end);
      } while (!bVar8);
      iVar18 = 0;
      ppcVar17 = extraout_RDX;
      ppcVar5 = local_358;
      bVar19 = bVar13;
      goto LAB_00397be8;
    }
    ppcVar17 = &end;
    bVar7 = Advance<char_const*>((char **)&local_358,separator,10,ppcVar17);
    if (!bVar7) {
      bVar13 = (byte)this->flags_;
      if (((this->flags_ & 0x81U) != 0) &&
         (ppcVar17 = local_358, (*(byte *)local_358 | 0x20) == 0x78)) {
        ppcVar17 = (char **)((long)local_358 + 1);
        local_358 = ppcVar17;
        if (ppcVar17 != end_00) {
          if ((char)bVar13 < '\0') {
            bVar7 = false;
            start = (char *)ppcVar17;
            buffer._0_8_ = end_00;
            do {
              bVar13 = *start;
              bVar8 = isDigit((int)(char)bVar13,0x10);
              if (!bVar8) {
                if (bVar13 != 0x2e) goto LAB_003980d4;
                bVar8 = Advance<char_const*>(&start,separator,0x10,(char **)buffer);
                if (!bVar8) {
                  goto LAB_00398044;
                }
                break;
              }
              bVar8 = Advance<char_const*>(&start,separator,0x10,(char **)buffer);
              bVar7 = true;
            } while (!bVar8);
          }
          goto LAB_003981d5;
        }
        goto LAB_00397eee;
      }
      do {
        if (*(char *)local_358 != '0') {
          bVar13 = bVar13 >> 1;
          goto LAB_00397b38;
        }
        ppcVar17 = &end;
        bVar7 = Advance<char_const*>((char **)&local_358,separator,10,ppcVar17);
      } while (!bVar7);
    }
    *processed_characters_count = (int)local_358 - iVar21;
LAB_00397c81:
    if (bVar6 == false) {
      dVar27 = 0.0;
    }
    else {
      dVar27 = -0.0;
    }
    goto LAB_0039834e;
  }
  bVar8 = SUB41((uVar2 & 0x40) >> 6,0);
  bVar7 = anon_unknown_0::ConsumeFirstCharacter(cVar9,this->infinity_symbol_,bVar8);
  if (!bVar7) {
    cVar9 = *(char *)ppcVar5;
    goto LAB_00397ab8;
  }
  bVar7 = (anonymous_namespace)::ConsumeSubString<char_const*>
                    ((char **)&local_358,(char *)end_00,this->infinity_symbol_,bVar8);
  if (!bVar7) goto LAB_00398348;
  if ((uVar2 & 0x14) != 0) {
    if ((uVar2 & 4) == 0) goto LAB_00397e64;
LAB_00397e75:
    *processed_characters_count = (int)local_358 - iVar21;
    if (bVar6 == false) {
      dVar27 = INFINITY;
    }
    else {
      dVar27 = -INFINITY;
    }
    goto LAB_0039834e;
  }
  if (local_358 == end_00) {
LAB_00397e64:
    bVar7 = AdvanceToNonspace<char_const*>((char **)&local_358,(char *)end_00);
    if (!bVar7) goto LAB_00397e75;
  }
  goto LAB_00397eee;
LAB_003980d4:
  if (((!bVar7) || ((bVar13 | 0x20) != 0x70)) ||
     (bVar7 = Advance<char_const*>(&start,separator,0x10,(char **)buffer), bVar7))
  goto LAB_003981d5;
  cVar9 = *start;
  if ((cVar9 == '-') || (cVar9 == '+')) {
    bVar7 = Advance<char_const*>(&start,separator,0x10,(char **)buffer);
    if (bVar7) goto LAB_003981d5;
    cVar9 = *start;
  }
  if (('9' < cVar9) || (9 < (int)cVar9 - 0x30U)) goto LAB_003981d5;
  bVar7 = Advance<char_const*>(&start,separator,0x10,(char **)buffer);
  if (!bVar7) {
    do {
      if ((0x39 < *start) || (9 < (int)*start - 0x30U)) {
        if ((uVar2 & 4) == 0) {
          bVar7 = AdvanceToNonspace<char_const*>(&start,(char *)end_00);
          uVar30 = 1;
          if (!bVar7) goto LAB_003981f5;
          goto LAB_003981d5;
        }
        break;
      }
      bVar7 = Advance<char_const*>(&start,separator,0x10,(char **)buffer);
    } while (!bVar7);
  }
  uVar30 = 1;
LAB_003981f5:
  dVar27 = this->junk_string_value_;
  buffer._0_8_ = end_00;
  do {
    uVar11 = CONCAT71((int7)((ulong)local_358 >> 8),*(char *)local_358);
    if (*(char *)local_358 != '0') {
      lVar10 = 0x18;
      if (read_as_double) {
        lVar10 = 0x35;
      }
      bVar7 = false;
      uVar29 = 0;
      this_00 = (Double *)0x0;
      goto LAB_00398270;
    }
    bVar7 = Advance<char_const*>((char **)&local_358,separator,0x10,(char **)buffer);
  } while (!bVar7);
  if (bVar6 == false) {
    dVar27 = 0.0;
  }
  else {
LAB_003986c7:
    dVar27 = -0.0;
  }
LAB_003986d4:
  if ((uVar2 & 0x10) != 0) {
    AdvanceToNonspace<char_const*>((char **)&local_358,(char *)end_00);
  }
  *processed_characters_count = (int)local_358 - iVar21;
  goto LAB_0039834e;
LAB_00398270:
  cVar14 = (char)uVar30;
  cVar9 = (char)uVar11;
  iVar23 = (int)cVar9;
  uVar15 = iVar23 - 0x30;
  if (9 < uVar15) {
    if ((byte)(cVar9 + 0x9fU) < 6) {
      uVar15 = iVar23 - 0x57;
      goto LAB_00398295;
    }
    uVar15 = (uint)uVar11 - 0x41;
    uVar12 = (ulong)uVar15;
    if ((byte)uVar15 < 6) {
      uVar15 = iVar23 - 0x37;
      goto LAB_00398295;
    }
    if (cVar14 == '\0') {
LAB_00398584:
      if (((uVar2 & 4) == 0) &&
         (bVar7 = AdvanceToNonspace<char_const*>((char **)&local_358,(char *)end_00),
         uVar12 = extraout_RDX_08, bVar7)) goto LAB_0039834e;
      goto joined_r0x0039851d;
    }
    if (cVar9 != '.') {
      uVar15 = (uint)uVar11 & 0xff;
      if ((uVar15 != 0x50) && (uVar15 != 0x70)) goto LAB_00398584;
      goto LAB_003985c4;
    }
    Advance<char_const*>((char **)&local_358,separator,0x10,(char **)buffer);
    bVar7 = true;
LAB_003982e5:
    uVar11 = CONCAT71((int7)((ulong)local_358 >> 8),*(char *)local_358);
    goto LAB_00398270;
  }
LAB_00398295:
  uVar22 = uVar29 - 4;
  if (!bVar7) {
    uVar22 = uVar29;
  }
  this_00 = (Double *)((ulong)uVar15 + (long)this_00 * 0x10);
  uVar12 = (long)this_00 >> (sbyte)lVar10;
  if ((int)uVar12 == 0) {
    bVar8 = Advance<char_const*>((char **)&local_358,separator,0x10,(char **)buffer);
    cVar14 = (char)uVar30;
    uVar29 = uVar22;
    uVar12 = extraout_RDX_02;
    if (!bVar8) goto LAB_003982e5;
    goto joined_r0x0039851d;
  }
  iVar23 = 0;
  bVar13 = 1;
  for (; 1 < (int)(uint)uVar12; uVar12 = (ulong)((uint)uVar12 >> 1)) {
    iVar23 = iVar23 + 1;
    bVar13 = bVar13 + 1;
  }
  uVar29 = (uint)this_00 & ~(-1 << (bVar13 & 0x1f));
  uVar20 = (long)this_00 >> (bVar13 & 0x3f);
  bVar13 = 1;
  iVar18 = iVar23 + uVar22 + 1;
  while( true ) {
    iVar25 = iVar18;
    bVar8 = Advance<char_const*>((char **)&local_358,separator,0x10,(char **)buffer);
    cVar14 = (char)uVar30;
    uVar12 = extraout_RDX_05;
    if (bVar8) break;
    if ((cVar14 != '\0') && (*(char *)local_358 == '.')) {
      Advance<char_const*>((char **)&local_358,separator,0x10,(char **)buffer);
      bVar7 = true;
    }
    cVar9 = *(char *)local_358;
    bVar8 = isDigit((int)cVar9,0x10);
    cVar14 = (char)uVar30;
    uVar12 = extraout_RDX_06;
    if (!bVar8) break;
    bVar13 = bVar13 & cVar9 == '0';
    iVar18 = iVar25 + 4;
    if (bVar7) {
      iVar18 = iVar25;
    }
  }
  if (((char)((uVar2 & 4) >> 2) == '\0' && cVar14 == '\0') &&
     (bVar7 = AdvanceToNonspace<char_const*>((char **)&local_358,(char *)end_00),
     uVar12 = extraout_RDX_07, bVar7)) goto LAB_0039834e;
  uVar15 = 1 << ((byte)iVar23 & 0x1f);
  if ((int)uVar15 < (int)uVar29) {
    uVar20 = uVar20 + 1;
  }
  else if (uVar29 == uVar15) {
    uVar20 = uVar20 + ((byte)(~bVar13 | (byte)uVar20) & 1);
  }
  bVar7 = (uVar20 >> lVar10 & 1) != 0;
  this_00 = (Double *)((long)uVar20 >> bVar7);
  uVar29 = iVar25 + (uint)bVar7;
joined_r0x0039851d:
  if (cVar14 != '\0') {
LAB_003985c4:
    Advance<char_const*>((char **)&local_358,separator,0x10,(char **)buffer);
    bVar7 = false;
    if (*(char *)local_358 == '+') {
LAB_003985f3:
      Advance<char_const*>((char **)&local_358,separator,0x10,(char **)buffer);
      uVar12 = extraout_RDX_10;
    }
    else {
      uVar12 = extraout_RDX_09;
      if (*(char *)local_358 == '-') {
        bVar7 = true;
        goto LAB_003985f3;
      }
    }
    uVar15 = 0;
    do {
      if (9 < (int)*(char *)local_358 - 0x30U) break;
      uVar22 = -uVar15;
      if (0 < (int)uVar15) {
        uVar22 = uVar15;
      }
      if (uVar22 < 0x17bb1) {
        uVar15 = uVar15 * 10 + -0x30 + (int)*(char *)local_358;
      }
      bVar8 = Advance<char_const*>((char **)&local_358,separator,0x10,(char **)buffer);
      uVar12 = extraout_RDX_11;
    } while (!bVar8);
    uVar22 = -uVar15;
    if (!bVar7) {
      uVar22 = uVar15;
    }
    uVar29 = uVar22 + uVar29;
  }
  if ((uVar29 == 0) || (this_00 == (Double *)0x0)) {
    if (bVar6 == false) {
LAB_003986c0:
      dVar27 = (double)(long)this_00;
      goto LAB_003986d4;
    }
    if (this_00 != (Double *)0x0) {
      this_00 = (Double *)-(long)this_00;
      goto LAB_003986c0;
    }
    goto LAB_003986c7;
  }
  diy_fp.f_ = (ulong)uVar29;
  diy_fp._8_8_ = uVar12;
  dVar27 = (double)Double::DiyFpToUint64(this_00,diy_fp);
  if (bVar6 != false) {
    dVar27 = -dVar27;
  }
  goto LAB_003986d4;
LAB_0039839f:
  if (*(char *)local_358 != '0') goto LAB_00397f2c;
  ppcVar16 = &end;
  bVar8 = Advance<char_const*>((char **)&local_358,separator,10,&end);
  if (bVar8) {
    *processed_characters_count = (int)local_358 - iVar21;
    goto LAB_00397c81;
  }
  iVar18 = iVar18 + -1;
  goto LAB_0039839f;
LAB_00397f2c:
  do {
    cVar14 = *(char *)local_358;
    uVar15 = (uint)CONCAT71((int7)((ulong)ppcVar16 >> 8),cVar14);
    ppcVar17 = (char **)(ulong)(uVar15 - 0x30);
    if (9 < (byte)(uVar15 - 0x30)) goto LAB_00397f8e;
    if (iVar23 < 0x304) {
      lVar10 = (long)(int)uVar29;
      uVar29 = uVar29 + 1;
      buffer[lVar10] = cVar14;
      iVar23 = iVar23 + 1;
      iVar18 = iVar18 + -1;
    }
    else {
      bVar7 = (bool)(cVar14 != '0' | bVar7);
    }
    ppcVar16 = &end;
    bVar8 = Advance<char_const*>((char **)&local_358,separator,10,&end);
    ppcVar17 = extraout_RDX_01;
    ppcVar5 = local_358;
  } while (!bVar8);
  goto LAB_00397be8;
LAB_00397f8e:
  ppcVar5 = local_358;
  ppcVar17 = (char **)CONCAT71((int7)((ulong)ppcVar17 >> 8),cVar9 != '0');
  if ((iVar23 == 0 && iVar18 == 0) && cVar9 != '0') {
LAB_00398348:
    dVar27 = this->junk_string_value_;
  }
  else {
    if ((uVar15 & 0xff | 0x20) == 0x65) {
      if (((~bVar19 | (byte)uVar2 >> 2) & 1) == 0) goto LAB_00398348;
      if ((bVar19 & 1) == 0) {
        ppcVar16 = (char **)((long)local_358 + 1);
        if ((ppcVar16 != end_00) &&
           ((((cVar9 = *(char *)ppcVar16, cVar9 != '-' && (cVar14 = '+', cVar9 != '+')) ||
             (ppcVar16 = (char **)((long)local_358 + 2), cVar14 = cVar9, ppcVar16 != end_00)) &&
            ((ppcVar16 != end_00 && (bVar13 = *(byte *)ppcVar16, 0xf5 < (byte)(bVar13 - 0x3a)))))))
        {
          uVar15 = 0;
          do {
            ppcVar16 = (char **)((long)ppcVar16 + 1);
            if (((int)uVar15 < 0x6666666) ||
               ((uVar22 = 0x3fffffff, uVar15 == 0x6666666 && (bVar13 < 0x34)))) {
              uVar22 = (uVar15 * 10 + (uint)bVar13) - 0x30;
            }
            uVar15 = uVar22;
          } while ((ppcVar16 != end_00) && (bVar13 = *(byte *)ppcVar16, (byte)(bVar13 - 0x30) < 10))
          ;
          uVar22 = -uVar15;
          if (cVar14 != '-') {
            uVar22 = uVar15;
          }
          ppcVar17 = (char **)(ulong)uVar22;
          iVar18 = iVar18 + uVar22;
          local_358 = ppcVar16;
          goto LAB_00397fee;
        }
        local_358 = ppcVar16;
        ppcVar17 = local_358;
        if ((uVar2 & 4) == 0) goto LAB_00398348;
      }
    }
    else {
LAB_00397fee:
      if ((uVar2 & 0x14) == 0) {
        if (local_358 != end_00) goto LAB_00398348;
LAB_00398337:
        bVar8 = AdvanceToNonspace<char_const*>((char **)&local_358,(char *)end_00);
        ppcVar17 = extraout_RDX_03;
        if (bVar8) goto LAB_00398348;
      }
      else if ((uVar2 & 4) == 0) goto LAB_00398337;
      ppcVar5 = local_358;
      if ((uVar2 & 0x10) != 0) {
        AdvanceToNonspace<char_const*>((char **)&local_358,(char *)end_00);
        ppcVar17 = extraout_RDX_04;
        ppcVar5 = local_358;
      }
    }
LAB_00397be8:
    local_358 = ppcVar5;
    if ((bVar19 & 1) == 0) {
      local_3b0 = local_3b0 + iVar18;
LAB_00397dfd:
      if (bVar7) {
        lVar10 = (long)(int)uVar29;
        uVar29 = uVar29 + 1;
        buffer[lVar10] = '1';
        local_3b0 = local_3b0 + -1;
      }
      buffer[(int)uVar29] = '\0';
      VVar28.start_ = (char *)(ulong)uVar29;
      VVar28._8_8_ = ppcVar17;
      VVar28 = TrimTrailingZeros((double_conversion *)buffer,VVar28);
      local_3b0 = (uVar29 - VVar28.length_) + local_3b0;
      auVar4 = VVar28._0_12_;
      if (read_as_double) {
        trimmed._12_4_ = 0;
        trimmed.start_ = (char *)auVar4._0_8_;
        trimmed.length_ = auVar4._8_4_;
        dVar27 = StrtodTrimmed(trimmed,local_3b0);
      }
      else {
        trimmed_00._12_4_ = 0;
        trimmed_00.start_ = (char *)auVar4._0_8_;
        trimmed_00.length_ = auVar4._8_4_;
        fVar26 = StrtofTrimmed(trimmed_00,local_3b0);
        dVar27 = (double)fVar26;
      }
      *processed_characters_count = (int)local_358 - iVar21;
      if (bVar6 != false) {
        dVar27 = -dVar27;
      }
    }
    else {
      start = buffer;
      dVar27 = RadixStringToIeee<3,char*>
                         (&start,buffer + (int)uVar29,bVar6,separator,SUB41((uVar2 & 4) >> 2,0),
                          read_as_double,this->junk_string_value_,SUB81(&local_361,0),
                          (bool *)CONCAT44(uVar29,in_stack_fffffffffffffc40));
      *processed_characters_count = (int)local_358 - iVar21;
    }
  }
  goto LAB_0039834e;
  while( true ) {
    bVar8 = Advance<char_const*>(&start,separator,0x10,(char **)buffer);
    bVar7 = true;
    if (bVar8) break;
LAB_00398044:
    bVar13 = *start;
    bVar8 = isDigit((int)(char)bVar13,0x10);
    if (!bVar8) goto LAB_003980d4;
  }
LAB_003981d5:
  bVar7 = isDigit((int)*(char *)ppcVar17,0x10);
  if (bVar7) {
    uVar30 = 0;
    goto LAB_003981f5;
  }
LAB_00397eee:
  dVar27 = this->junk_string_value_;
LAB_0039834e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return dVar27;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;
  const bool allow_case_insensitivity = (flags_ & ALLOW_CASE_INSENSITIVITY) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, infinity_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, infinity_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, nan_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, nan_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    if (Advance(&current, separator_, 10, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if (((flags_ & ALLOW_HEX) || (flags_ & ALLOW_HEX_FLOATS)) &&
        (*current == 'x' || *current == 'X')) {
      ++current;

      if (current == end) return junk_string_value_;  // "0x"

      bool parse_as_hex_float = (flags_ & ALLOW_HEX_FLOATS) &&
                IsHexFloatString(current, end, separator_, allow_trailing_junk);

      if (!parse_as_hex_float && !isDigit(*current, 16)) {
        return junk_string_value_;
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           separator_,
                                           parse_as_hex_float,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      if (Advance(&current, separator_, 10, end)) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  DOUBLE_CONVERSION_STACK_UNINITIALIZED char
      buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    if (Advance(&current, separator_, 10, end)) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    if (Advance(&current, separator_, 10, end)) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        if (Advance(&current, separator_, 10, end)) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      if (Advance(&current, separator_, 10, end)) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    Iterator junk_begin = current;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          current = junk_begin;
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    DOUBLE_CONVERSION_ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  separator_,
                                  false, // Don't parse as hex_float.
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    DOUBLE_CONVERSION_ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  // Code above ensures there are no leading zeros and the buffer has fewer than
  // kMaxSignificantDecimalDigits characters. Trim trailing zeros.
  Vector<const char> chars(buffer, buffer_pos);
  chars = TrimTrailingZeros(chars);
  exponent += buffer_pos - chars.length();

  double converted;
  if (read_as_double) {
    converted = StrtodTrimmed(chars, exponent);
  } else {
    converted = StrtofTrimmed(chars, exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}